

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

lws_parser_return_t lws_parse(lws *wsi,uchar *buf,int *len)

{
  uint16_t *puVar1;
  byte bVar2;
  ah_data_idx_t aVar3;
  allocated_headers *paVar4;
  allocated_headers *paVar5;
  lws_fragments *plVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  long lVar14;
  uint uVar15;
  byte bVar16;
  char *__nptr;
  uchar c;
  char dotstar [64];
  byte local_85;
  uint local_84;
  lws_context *local_80;
  char local_78 [72];
  
  paVar4 = (wsi->http).ah;
  if (paVar4 == (allocated_headers *)0x0) {
    __assert_fail("wsi->http.ah",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x3e4,"lws_parser_return_t lws_parse(struct lws *, unsigned char *, int *)");
  }
  local_80 = (wsi->a).context;
  do {
    *len = *len + -1;
    bVar16 = *buf;
    local_85 = bVar16;
    switch(paVar4->parser_state) {
    case 'a':
      _lws_log(0x20,"WSI_TOKEN_NAME_PART \'%c\' 0x%02X (role=0x%lx) wsi->lextable_pos=%d\n",bVar16,
               bVar16,(ulong)*(ushort *)((long)&wsi->wsistate + 2) << 0x10,
               (ulong)(uint)(int)paVar4->lextable_pos);
      if (paVar4->unk_pos == 0 && bVar16 == 10) {
LAB_0011ace2:
        if (paVar4->ues == '\0') {
          paVar5 = (wsi->http).ah;
          if ((paVar5 != (allocated_headers *)0x0) && (bVar16 = paVar5->frag_index[5], bVar16 != 0))
          {
            iVar10 = 0;
            do {
              uVar11 = (ulong)bVar16;
              bVar16 = paVar5->frags[bVar16].nfrag;
              iVar10 = (uint)(bVar16 != 0) + (uint)paVar5->frags[uVar11].len + iVar10;
            } while (bVar16 != 0);
            if (iVar10 != 0) {
              if ((paVar5 == (allocated_headers *)0x0) || ((ulong)paVar5->frag_index[0x21] == 0)) {
                __nptr = (char *)0x0;
              }
              else {
                __nptr = paVar5->data + paVar5->frags[paVar5->frag_index[0x21]].offset;
              }
              if (__nptr != (char *)0x0) {
                iVar10 = atoi(__nptr);
                wsi->rx_frame_type = (char)iVar10;
              }
              _lws_log(0x20,"v%02d hdrs done\n",(ulong)(uint)(int)wsi->rx_frame_type);
            }
          }
          paVar4->parser_state = 'e';
          wsi->field_0x46e = wsi->field_0x46e | 1;
          return LPR_OK;
        }
switchD_0011aa14_caseD_2:
        _lws_log(8," forbidding on uri sanitation\n");
        lws_return_http_status(wsi,0x193,(char *)0x0);
        return LPR_FORBIDDEN;
      }
      if ((byte)(bVar16 + 0xbf) < 0x1a) {
        local_85 = bVar16 | 0x20;
      }
      if ((paVar4->unk_pos == 0) && ((*(ulong *)&wsi->field_0x46e & 2) == 0)) {
        paVar4->unk_pos = paVar4->pos;
        iVar10 = 8;
        do {
          iVar8 = lws_pos_in_bounds(wsi);
          if (iVar8 == 0) {
            uVar15 = paVar4->pos;
            paVar4->pos = uVar15 + 1;
            paVar4->data[uVar15] = '\0';
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      iVar10 = lws_pos_in_bounds(wsi);
      if (iVar10 != 0) {
        return LPR_FAIL;
      }
      uVar15 = paVar4->pos;
      paVar4->pos = uVar15 + 1;
      paVar4->data[uVar15] = local_85;
      uVar13 = paVar4->lextable_pos;
      if ((local_85 == 0x3a && (*(ulong *)&wsi->field_0x46e & 2) == 0) && (short)uVar13 < 0) {
        if (paVar4->unk_ll_head == 0) {
          paVar4->unk_ll_head = paVar4->unk_pos;
        }
        if (paVar4->unk_ll_tail != 0) {
          lws_ser_wu32be((uint8_t *)(paVar4->data + (paVar4->unk_ll_tail + 4)),paVar4->unk_pos);
        }
        aVar3 = paVar4->unk_pos;
        paVar4->unk_ll_tail = aVar3;
        uVar15 = (paVar4->pos - aVar3) - 7;
        if (0x3f < uVar15) {
          uVar15 = 0x40;
        }
        lws_strncpy(local_78,paVar4->data + (aVar3 + 8),(ulong)uVar15);
        _lws_log(0x10,"%s: unk header %d \'%s\'\n","lws_parse",
                 (ulong)((paVar4->pos - paVar4->unk_pos) - 8),local_78);
        lws_ser_wu16be((uint8_t *)(paVar4->data + paVar4->unk_pos),
                       ((short)paVar4->pos - (short)paVar4->unk_pos) - 8);
        paVar4->unk_value_pos = paVar4->pos;
        paVar4->parser_state = 'b';
      }
      else if (-1 < (short)uVar13) {
        uVar15 = (uint)uVar13;
        bVar16 = "g@"[uVar13];
        if (-1 < (char)bVar16) {
          uVar11 = (ulong)uVar13 + 1;
          do {
            if (bVar16 == 8) {
              uVar9 = 0xffff;
              goto LAB_0011aad7;
            }
            iVar10 = (int)uVar11;
            if (bVar16 < 8) {
              if ((*(ulong *)&wsi->field_0x46e & 2) == 0) {
                paVar4->pos = paVar4->unk_pos;
                paVar4->unk_pos = 0;
              }
              uVar9 = iVar10 - 1;
              goto LAB_0011aad7;
            }
            if (bVar16 == local_85) {
              uVar9 = (iVar10 + (uint)CONCAT11("g@"[iVar10 + 1],"g@"[uVar11 & 0xffffffff])) - 1;
              goto LAB_0011aad7;
            }
            bVar16 = "g@"[uVar11 + 2];
            uVar11 = uVar11 + 3;
          } while (-1 < (char)bVar16);
          uVar15 = (int)uVar11 - 1;
        }
        uVar9 = 0xffff;
        if (((bVar16 & 0x7f) == local_85) &&
           (uVar9 = uVar15 + 1, "g@"[(long)(int)uVar15 + 1] == '\b')) {
          uVar9 = 0xffff;
        }
LAB_0011aad7:
        sVar7 = (short)uVar9;
        paVar4->lextable_pos = sVar7;
        if (((sVar7 < 0) && (wsi->role_ops == &role_ops_h1)) && ((wsi->wsistate & 0x20000000) != 0))
        {
          lVar14 = 0;
          do {
            if (paVar4->frag_index[""[lVar14]] != '\0') {
              if ((wsi->field_0x46e & 2) != 0) {
                paVar4->parser_state = 'c';
              }
              goto LAB_0011acca;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          lVar14 = 8;
LAB_0011acca:
          if ((int)lVar14 == 8) {
            if ((((wsi->a).vhost)->options & 0x100000) != 0) {
              _lws_log(4,"%s: http fail fallback\n","lws_parse");
              return LPR_DO_FALLBACK;
            }
            _lws_log(8,"Unknown method - dropping\n");
            goto switchD_0011aa14_caseD_2;
          }
          if ((wsi->field_0x46e & 2) == 0) goto LAB_0011abe0;
        }
        else if (sVar7 < 0) {
          if ((wsi->field_0x46e & 2) != 0) goto LAB_0011a732;
LAB_0011abe0:
          if ((wsi->field_0x46e & 2) != 0) goto LAB_0011ac06;
        }
        else if ("g@"[uVar9 & 0xffff] < 8) {
          local_84 = (uint)"g@"[(long)sVar7 + 1];
          uVar15 = (uint)CONCAT11("g@"[uVar9 & 0xffff],"g@"[(long)sVar7 + 1]);
          _lws_log(0x20,"known hdr %d\n",(ulong)uVar15);
          lVar14 = 0;
          do {
            if ((uVar15 == ""[lVar14]) && (paVar4->frag_index[""[lVar14]] != '\0')) {
              _lws_log(2,"Duplicated method\n");
              return LPR_FAIL;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
          if ((wsi->field_0x46e & 2) == 0) {
            paVar4->pos = paVar4->unk_pos;
            paVar4->unk_pos = 0;
          }
          bVar16 = (byte)local_84;
          if (uVar15 == 0x22) {
            bVar16 = 6;
          }
          paVar4->parser_state = bVar16;
          paVar4->ups = '\0';
          if (local_80->token_limits == (lws_token_limits *)0x0) {
            uVar15 = ((wsi->a).context)->max_http_header_data;
          }
          else {
            uVar15 = (uint)local_80->token_limits->token_limit[bVar16];
          }
          paVar4->current_token_limit = uVar15;
          if (bVar16 != 8) goto LAB_0011ac06;
          goto LAB_0011ace2;
        }
      }
      break;
    case 'b':
      if (bVar16 != 0xd) {
        if (bVar16 == 10) {
          lws_ser_wu16be((uint8_t *)(paVar4->data + (paVar4->unk_pos + 2)),
                         (short)paVar4->pos - (short)paVar4->unk_value_pos);
LAB_0011a775:
          paVar4->parser_state = 'a';
          paVar4->unk_pos = 0;
          paVar4->lextable_pos = 0;
        }
        else if ((paVar4->pos != paVar4->unk_value_pos) || ((bVar16 != 9 && (bVar16 != 0x20)))) {
          iVar10 = lws_pos_in_bounds(wsi);
          if (iVar10 != 0) {
            return LPR_FAIL;
          }
          uVar15 = paVar4->pos;
          paVar4->pos = uVar15 + 1;
          paVar4->data[uVar15] = bVar16;
        }
      }
      break;
    case 'c':
      _lws_log(0x20,"WSI_TOKEN_SKIPPING \'%c\'\n",bVar16);
      if (bVar16 == 0xd) {
        paVar4->parser_state = 'd';
      }
      else if (bVar16 == 10) goto LAB_0011a775;
      break;
    case 'd':
      _lws_log(0x20,"WSI_TOKEN_SKIPPING_SAW_CR \'%c\'\n",bVar16);
      if (paVar4->ues != '\0') goto switchD_0011aa14_caseD_2;
      if (bVar16 == 10) goto LAB_0011a775;
LAB_0011a732:
      paVar4->parser_state = 'c';
      break;
    case 'e':
      _lws_log(0x20,"WSI_PARSING_COMPLETE \'%c\'\n",bVar16);
      break;
    default:
      _lws_log(0x20,"WSI_TOK_(%d) \'%c\'\n",(ulong)paVar4->parser_state,bVar16);
      if (paVar4->frags[paVar4->frag_index[paVar4->parser_state]].len != 0 || bVar16 != 0x20) {
        lVar14 = 0;
        do {
          if (paVar4->parser_state == ""[lVar14]) goto LAB_0011a7f2;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 8);
        lVar14 = 8;
LAB_0011a7f2:
        if ((int)lVar14 == 8) {
switchD_0011aa14_caseD_0:
          if ((paVar4->parser_state != '\b') && ((local_85 == 0xd || (local_85 == 10)))) {
            if (paVar4->ues != '\0') goto switchD_0011aa14_caseD_2;
            if (local_85 == 10) {
              paVar4->parser_state = 'a';
              paVar4->unk_pos = 0;
              paVar4->lextable_pos = 0;
            }
            else {
              paVar4->parser_state = 'd';
            }
            local_85 = 0;
            _lws_log(0x20,"*\n");
          }
          bVar16 = local_85;
          iVar10 = issue_char(wsi,local_85);
          if (iVar10 < 0) {
            return LPR_FAIL;
          }
          if (iVar10 == 0) {
            if ((bVar16 == 0) && (paVar4->parser_state != 'L')) {
              paVar5 = (wsi->http).ah;
              puVar1 = &paVar5->frags[paVar5->nfrag].len;
              *puVar1 = *puVar1 - 1;
            }
          }
          else {
            paVar4->parser_state = 'c';
          }
switchD_0011aa14_caseD_1:
          if (paVar4->parser_state == '\b') goto LAB_0011ace2;
        }
        else {
          if (bVar16 != 0x20) {
            iVar10 = lws_parse_urldecode(wsi,&local_85);
            switch(iVar10) {
            case 0:
              goto switchD_0011aa14_caseD_0;
            case 1:
              goto switchD_0011aa14_caseD_1;
            case 2:
              goto switchD_0011aa14_caseD_2;
            case 3:
              goto switchD_0011aa14_caseD_3;
            default:
              goto LAB_0011adde;
            }
          }
          if ((paVar4->frags[paVar4->nfrag].len == 0) && (iVar10 = issue_char(wsi,'/'), iVar10 < 0))
          {
            return LPR_FAIL;
          }
          if (paVar4->ups == '\x03') {
            bVar16 = paVar4->nfrag;
            uVar13 = paVar4->frags[bVar16].len;
            if (2 < uVar13) {
              aVar3 = paVar4->pos;
              paVar4->pos = aVar3 - 1;
              paVar4->frags[bVar16].len = uVar13 - 1;
              uVar13 = uVar13 - 2;
              uVar15 = aVar3 - 2;
              do {
                paVar4->pos = uVar15;
                paVar4->frags[bVar16].len = uVar13;
                if (uVar13 < 2) break;
                uVar11 = (ulong)uVar15;
                uVar13 = uVar13 - 1;
                uVar15 = uVar15 - 1;
              } while (paVar4->data[uVar11] != '/');
            }
          }
          iVar10 = issue_char(wsi,'\0');
          if (iVar10 < 0) {
            return LPR_FAIL;
          }
          paVar5 = (wsi->http).ah;
          puVar1 = &paVar5->frags[paVar5->nfrag].len;
          *puVar1 = *puVar1 - 1;
          paVar4->parser_state = '\x0f';
LAB_0011ac06:
          paVar4->nfrag = paVar4->nfrag + '\x01';
switchD_0011aa14_caseD_3:
          bVar16 = paVar4->nfrag;
          uVar11 = (ulong)bVar16;
          if (uVar11 == 0x60) {
            _lws_log(2,"More hdr frags than we can deal with\n");
LAB_0011adde:
            return LPR_FAIL;
          }
          paVar4->frags[uVar11].offset = paVar4->pos;
          plVar6 = paVar4->frags + uVar11;
          plVar6->len = 0;
          plVar6->nfrag = '\0';
          plVar6->flags = '\x02';
          bVar2 = paVar4->frag_index[paVar4->parser_state];
          if (paVar4->frag_index[paVar4->parser_state] == 0) {
            paVar4->frag_index[paVar4->parser_state] = bVar16;
            paVar4->hdr_token_idx = (uint)paVar4->parser_state;
          }
          else {
            do {
              bVar12 = bVar2;
              bVar2 = paVar4->frags[bVar12].nfrag;
            } while (bVar2 != 0);
            paVar4->frags[bVar12].nfrag = bVar16;
            iVar10 = issue_char(wsi,' ');
            if (iVar10 < 0) {
              return LPR_FAIL;
            }
          }
        }
      }
    }
    buf = buf + 1;
    if (*len == 0) {
      return LPR_OK;
    }
  } while( true );
}

Assistant:

lws_parser_return_t LWS_WARN_UNUSED_RESULT
lws_parse(struct lws *wsi, unsigned char *buf, int *len)
{
	struct allocated_headers *ah = wsi->http.ah;
	struct lws_context *context = wsi->a.context;
	unsigned int n, m;
	unsigned char c;
	int r, pos;

	assert(wsi->http.ah);

	do {
		(*len)--;
		c = *buf++;

		switch (ah->parser_state) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
		case WSI_TOKEN_UNKNOWN_VALUE_PART:

			if (c == '\r')
				break;
			if (c == '\n') {
				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos + 2],
					       (uint16_t)(ah->pos - ah->unk_value_pos));
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
				break;
			}

			/* trim leading whitespace */
			if (ah->pos != ah->unk_value_pos ||
			    (c != ' ' && c != '\t')) {

				if (lws_pos_in_bounds(wsi))
					return LPR_FAIL;

				ah->data[ah->pos++] = (char)c;
			}
			pos = ah->lextable_pos;
			break;
#endif
		default:

			lwsl_parser("WSI_TOK_(%d) '%c'\n", ah->parser_state, c);

			/* collect into malloc'd buffers */
			/* optional initial space swallow */
			if (!ah->frags[ah->frag_index[ah->parser_state]].len &&
			    c == ' ')
				break;

			for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
				if (ah->parser_state == methods[m])
					break;
			if (m == LWS_ARRAY_SIZE(methods))
				/* it was not any of the methods */
				goto check_eol;

			/* special URI processing... end at space */

			if (c == ' ') {
				/* enforce starting with / */
				if (!ah->frags[ah->nfrag].len)
					if (issue_char(wsi, '/') < 0)
						return LPR_FAIL;

				if (ah->ups == URIPS_SEEN_SLASH_DOT_DOT) {
					/*
					 * back up one dir level if possible
					 * safe against header fragmentation
					 * because the method URI can only be
					 * in 1 fragment
					 */
					if (ah->frags[ah->nfrag].len > 2) {
						ah->pos--;
						ah->frags[ah->nfrag].len--;
						do {
							ah->pos--;
							ah->frags[ah->nfrag].len--;
						} while (ah->frags[ah->nfrag].len > 1 &&
							 ah->data[ah->pos] != '/');
					}
				}

				/* begin parsing HTTP version: */
				if (issue_char(wsi, '\0') < 0)
					return LPR_FAIL;
				/* don't account for it */
				wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
				ah->parser_state = WSI_TOKEN_HTTP;
				goto start_fragment;
			}

			r = lws_parse_urldecode(wsi, &c);
			switch (r) {
			case LPUR_CONTINUE:
				break;
			case LPUR_SWALLOW:
				goto swallow;
			case LPUR_FORBID:
				goto forbid;
			case LPUR_EXCESSIVE:
				goto excessive;
			default:
				return LPR_FAIL;
			}
check_eol:
			/* bail at EOL */
			if (ah->parser_state != WSI_TOKEN_CHALLENGE &&
			    (c == '\x0d' || c == '\x0a')) {
				if (ah->ues != URIES_IDLE)
					goto forbid;

				if (c == '\x0a') {
					/* broken peer */
					ah->parser_state = WSI_TOKEN_NAME_PART;
					ah->unk_pos = 0;
					ah->lextable_pos = 0;
				} else
					ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;

				c = '\0';
				lwsl_parser("*\n");
			}

			n = (unsigned int)issue_char(wsi, c);
			if ((int)n < 0)
				return LPR_FAIL;
			if (n > 0)
				ah->parser_state = WSI_TOKEN_SKIPPING;
			else {
				/*
				 * Explicit zeroes are legal in URI ARGS.
				 * They can only exist as a safety terminator
				 * after the valid part of the token contents
				 * for other types.
				 */
				if (!c && ah->parser_state != WSI_TOKEN_HTTP_URI_ARGS)
					/* don't account for safety terminator */
					wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
			}

swallow:
			/* per-protocol end of headers management */

			if (ah->parser_state == WSI_TOKEN_CHALLENGE)
				goto set_parsing_complete;
			break;

			/* collecting and checking a name part */
		case WSI_TOKEN_NAME_PART:
			lwsl_parser("WSI_TOKEN_NAME_PART '%c' 0x%02X "
				    "(role=0x%lx) "
				    "wsi->lextable_pos=%d\n", c, c,
				    (unsigned long)lwsi_role(wsi),
				    ah->lextable_pos);

			if (!ah->unk_pos && c == '\x0a')
				/* broken peer */
				goto set_parsing_complete;

			if (c >= 'A' && c <= 'Z')
				c = (unsigned char)(c + 'a' - 'A');
			/*
			 * ...in case it's an unknown header, speculatively
			 * store it as the name comes in.  If we recognize it as
			 * a known header, we'll snip this.
			 */

			if (!wsi->mux_substream && !ah->unk_pos) {
				ah->unk_pos = ah->pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
				/*
				 * Prepare new unknown header linked-list entry
				 *
				 *  - 16-bit BE: name part length
				 *  - 16-bit BE: value part length
				 *  - 32-bit BE: data offset of next, or 0
				 */
				for (n = 0; n < 8; n++)
					if (!lws_pos_in_bounds(wsi))
						ah->data[ah->pos++] = 0;
#endif
			}

			if (lws_pos_in_bounds(wsi))
				return LPR_FAIL;

			ah->data[ah->pos++] = (char)c;
			pos = ah->lextable_pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
			if (!wsi->mux_substream && pos < 0 && c == ':') {
#if defined(_DEBUG)
				char dotstar[64];
				int uhlen;
#endif

				/*
				 * process unknown headers
				 *
				 * register us in the unknown hdr ll
				 */

				if (!ah->unk_ll_head)
					ah->unk_ll_head = ah->unk_pos;

				if (ah->unk_ll_tail)
					lws_ser_wu32be(
				(uint8_t *)&ah->data[ah->unk_ll_tail + UHO_LL],
						       ah->unk_pos);

				ah->unk_ll_tail = ah->unk_pos;

#if defined(_DEBUG)
				uhlen = (int)(ah->pos - (ah->unk_pos + UHO_NAME));
				lws_strnncpy(dotstar,
					&ah->data[ah->unk_pos + UHO_NAME],
					uhlen, sizeof(dotstar));
				lwsl_debug("%s: unk header %d '%s'\n",
					    __func__,
					    ah->pos - (ah->unk_pos + UHO_NAME),
					    dotstar);
#endif

				/* set the unknown header name part length */

				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos],
					       (uint16_t)((ah->pos - ah->unk_pos) - UHO_NAME));

				ah->unk_value_pos = ah->pos;

				/*
				 * collect whatever's coming for the unknown header
				 * argument until the next CRLF
				 */
				ah->parser_state = WSI_TOKEN_UNKNOWN_VALUE_PART;
				break;
			}
#endif
			if (pos < 0)
				break;

			while (1) {
				if (lextable_h1[pos] & (1 << 7)) {
					/* 1-byte, fail on mismatch */
					if ((lextable_h1[pos] & 0x7f) != c) {
nope:
						ah->lextable_pos = -1;
						break;
					}
					/* fall thru */
					pos++;
					if (lextable_h1[pos] == FAIL_CHAR)
						goto nope;

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == FAIL_CHAR)
					goto nope;

				/* b7 = 0, end or 3-byte */
				if (lextable_h1[pos] < FAIL_CHAR) {
					if (!wsi->mux_substream) {
						/*
						 * We hit a terminal marker, so
						 * we recognized this header...
						 * drop the speculative name
						 * part storage
						 */
						ah->pos = ah->unk_pos;
						ah->unk_pos = 0;
					}

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == c) { /* goto */
					ah->lextable_pos = (int16_t)(pos +
						(lextable_h1[pos + 1]) +
						(lextable_h1[pos + 2] << 8));
					break;
				}

				/* fall thru goto */
				pos += 3;
				/* continue */
			}

			/*
			 * If it's h1, server needs to be on the look out for
			 * unknown methods...
			 */
			if (ah->lextable_pos < 0 && lwsi_role_h1(wsi) &&
			    lwsi_role_server(wsi)) {
				/*
				 * this is not a header we know about... did
				 * we get a valid method (GET, POST etc)
				 * already, or is this the bogus method?
				 */
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (ah->frag_index[methods[m]]) {
						/*
						 * already had the method
						 */
#if !defined(LWS_WITH_CUSTOM_HEADERS)
						ah->parser_state = WSI_TOKEN_SKIPPING;
#endif
						if (wsi->mux_substream)
							ah->parser_state = WSI_TOKEN_SKIPPING;
						break;
					}

				if (m != LWS_ARRAY_SIZE(methods)) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
					/*
					 * We have the method, this is just an
					 * unknown header then
					 */
					if (!wsi->mux_substream)
						goto unknown_hdr;
					else
						break;
#else
					break;
#endif
				}
				/*
				 * ...it's an unknown http method from a client
				 * in fact, it cannot be valid http.
				 *
				 * Are we set up to transition to another role
				 * in these cases?
				 */
				if (lws_check_opt(wsi->a.vhost->options,
		    LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_ACCEPT_CONFIG)) {
					lwsl_notice("%s: http fail fallback\n",
						    __func__);
					 /* transition to other role */
					return LPR_DO_FALLBACK;
				}

				lwsl_info("Unknown method - dropping\n");
				goto forbid;
			}
			if (ah->lextable_pos < 0) {
				/*
				 * It's not a header that lws knows about...
				 */
#if defined(LWS_WITH_CUSTOM_HEADERS)
				if (!wsi->mux_substream)
					goto unknown_hdr;
#endif
				/*
				 * ...otherwise for a client, let him ignore
				 * unknown headers coming from the server
				 */
				ah->parser_state = WSI_TOKEN_SKIPPING;
				break;
			}

			if (lextable_h1[ah->lextable_pos] < FAIL_CHAR) {
				/* terminal state */

				n = ((unsigned int)lextable_h1[ah->lextable_pos] << 8) |
						lextable_h1[ah->lextable_pos + 1];

				lwsl_parser("known hdr %d\n", n);
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (n == methods[m] &&
					    ah->frag_index[methods[m]]) {
						lwsl_warn("Duplicated method\n");
						return LPR_FAIL;
					}

				if (!wsi->mux_substream) {
					/*
					 * Whether we are collecting unknown names or not,
					 * if we matched an internal header we can dispense
					 * with the header name part we were keeping
					 */
					ah->pos = ah->unk_pos;
					ah->unk_pos = 0;
				}

#if defined(LWS_ROLE_WS)
				/*
				 * WSORIGIN is protocol equiv to ORIGIN,
				 * JWebSocket likes to send it, map to ORIGIN
				 */
				if (n == WSI_TOKEN_SWORIGIN)
					n = WSI_TOKEN_ORIGIN;
#endif

				ah->parser_state = (uint8_t)
							(WSI_TOKEN_GET_URI + n);
				ah->ups = URIPS_IDLE;

				if (context->token_limits)
					ah->current_token_limit = context->
						token_limits->token_limit[
							      ah->parser_state];
				else
					ah->current_token_limit =
						wsi->a.context->max_http_header_data;

				if (ah->parser_state == WSI_TOKEN_CHALLENGE)
					goto set_parsing_complete;

				goto start_fragment;
			}
			break;

#if defined(LWS_WITH_CUSTOM_HEADERS)
unknown_hdr:
			//ah->parser_state = WSI_TOKEN_SKIPPING;
			//break;
			if (!wsi->mux_substream)
				break;
#endif

start_fragment:
			ah->nfrag++;
excessive:
			if (ah->nfrag == LWS_ARRAY_SIZE(ah->frags)) {
				lwsl_warn("More hdr frags than we can deal with\n");
				return LPR_FAIL;
			}

			ah->frags[ah->nfrag].offset = ah->pos;
			ah->frags[ah->nfrag].len = 0;
			ah->frags[ah->nfrag].nfrag = 0;
			ah->frags[ah->nfrag].flags = 2;

			n = ah->frag_index[ah->parser_state];
			if (!n) { /* first fragment */
				ah->frag_index[ah->parser_state] = ah->nfrag;
				ah->hdr_token_idx = ah->parser_state;
				break;
			}
			/* continuation */
			while (ah->frags[n].nfrag)
				n = ah->frags[n].nfrag;
			ah->frags[n].nfrag = ah->nfrag;

			if (issue_char(wsi, ' ') < 0)
				return LPR_FAIL;
			break;

			/* skipping arg part of a name we didn't recognize */
		case WSI_TOKEN_SKIPPING:
			lwsl_parser("WSI_TOKEN_SKIPPING '%c'\n", c);

			if (c == '\x0a') {
				/* broken peer */
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			}

			if (c == '\x0d')
				ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;
			break;

		case WSI_TOKEN_SKIPPING_SAW_CR:
			lwsl_parser("WSI_TOKEN_SKIPPING_SAW_CR '%c'\n", c);
			if (ah->ues != URIES_IDLE)
				goto forbid;
			if (c == '\x0a') {
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			} else
				ah->parser_state = WSI_TOKEN_SKIPPING;
			break;
			/* we're done, ignore anything else */

		case WSI_PARSING_COMPLETE:
			lwsl_parser("WSI_PARSING_COMPLETE '%c'\n", c);
			break;
		}

	} while (*len);

	return LPR_OK;

set_parsing_complete:
	if (ah->ues != URIES_IDLE)
		goto forbid;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_UPGRADE)) {
#if defined(LWS_ROLE_WS)
		const char *pv = lws_hdr_simple_ptr(wsi, WSI_TOKEN_VERSION);
		if (pv)
			wsi->rx_frame_type = (char)atoi(pv);

		lwsl_parser("v%02d hdrs done\n", wsi->rx_frame_type);
#endif
	}
	ah->parser_state = WSI_PARSING_COMPLETE;
	wsi->hdr_parsing_completed = 1;

	return LPR_OK;

forbid:
	lwsl_info(" forbidding on uri sanitation\n");
#if defined(LWS_WITH_SERVER)
	lws_return_http_status(wsi, HTTP_STATUS_FORBIDDEN, NULL);
#endif

	return LPR_FORBIDDEN;
}